

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O0

Bit32u __thiscall MT32Emu::LA32Ramp::nextValue(LA32Ramp *this)

{
  int iVar1;
  LA32Ramp *this_local;
  
  if (this->interruptCountdown < 1) {
    if (this->largeIncrement != 0) {
      if ((this->descending & 1U) == 0) {
        if (0x3fc0000 - this->current < this->largeIncrement) {
          this->current = this->largeTarget;
          this->interruptCountdown = 7;
        }
        else {
          this->current = this->largeIncrement + this->current;
          if (this->largeTarget <= this->current) {
            this->current = this->largeTarget;
            this->interruptCountdown = 7;
          }
        }
      }
      else if (this->current < this->largeIncrement) {
        this->current = this->largeTarget;
        this->interruptCountdown = 7;
      }
      else {
        this->current = this->current - this->largeIncrement;
        if (this->current <= this->largeTarget) {
          this->current = this->largeTarget;
          this->interruptCountdown = 7;
        }
      }
    }
  }
  else {
    iVar1 = this->interruptCountdown + -1;
    this->interruptCountdown = iVar1;
    if (iVar1 == 0) {
      this->interruptRaised = true;
    }
  }
  return this->current;
}

Assistant:

Bit32u LA32Ramp::nextValue() {
	if (interruptCountdown > 0) {
		if (--interruptCountdown == 0) {
			interruptRaised = true;
		}
	} else if (largeIncrement != 0) {
		// CONFIRMED from sample analysis: When increment is 0, the LA32 does *not* change the current value at all (and of course doesn't fire an interrupt).
		if (descending) {
			// Lowering current value
			if (largeIncrement > current) {
				current = largeTarget;
				interruptCountdown = INTERRUPT_TIME;
			} else {
				current -= largeIncrement;
				if (current <= largeTarget) {
					current = largeTarget;
					interruptCountdown = INTERRUPT_TIME;
				}
			}
		} else {
			// Raising current value
			if (MAX_CURRENT - current < largeIncrement) {
				current = largeTarget;
				interruptCountdown = INTERRUPT_TIME;
			} else {
				current += largeIncrement;
				if (current >= largeTarget) {
					current = largeTarget;
					interruptCountdown = INTERRUPT_TIME;
				}
			}
		}
	}
	return current;
}